

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O3

void inner_product_suite::test_overfull(void)

{
  bool bVar1;
  reference piVar2;
  int iVar3;
  int *piVar4;
  initializer_list<int> input;
  initializer_list<int> input_00;
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_88;
  undefined4 local_78;
  iterator_type local_68;
  int local_58 [4];
  circular_view<int,_18446744073709551615UL> local_48;
  
  piVar4 = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_48.member.cap = 4;
  local_48.member.size = 0;
  local_48.member.next = 4;
  local_88.parent = (view_pointer)0x160000000b;
  local_88.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_88;
  local_48.member.data = piVar4;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_48,input);
  local_68.current = local_48.member.cap * 2;
  if ((local_68.current & local_48.member.cap * 2 - 1) == 0) {
    local_88.current = local_48.member.next - local_48.member.size & local_68.current - 1;
    local_68.current = local_68.current - 1 & local_48.member.next;
  }
  else {
    local_88.current = (local_48.member.next - local_48.member.size) % local_68.current;
    local_68.current = local_48.member.next % local_68.current;
  }
  local_88.parent = &local_48;
  local_68.parent = &local_48;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_68);
  iVar3 = 0;
  if (!bVar1) {
    iVar3 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      iVar3 = iVar3 + *piVar4 * *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      piVar4 = piVar4 + 1;
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_88,&local_68);
    } while (!bVar1);
  }
  local_88.parent = (view_pointer)CONCAT44(local_88.parent._4_4_,iVar3);
  local_68.parent = (view_pointer)CONCAT44(local_68.parent._4_4_,0xe2e);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "11 * 11 + 22 * 22 + 33 * 33 + 44 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x34,"void inner_product_suite::test_overfull()",&local_88,&local_68);
  local_88.parent = (view_pointer)0x160000000b;
  local_88.current = 0x2c00000021;
  local_78 = 0x37;
  input_00._M_len = 5;
  input_00._M_array = (iterator)&local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_48,input_00);
  local_68.current = local_48.member.cap * 2;
  if ((local_68.current & local_48.member.cap * 2 - 1) == 0) {
    local_88.current = local_48.member.next - local_48.member.size & local_68.current - 1;
    local_68.current = local_68.current - 1 & local_48.member.next;
  }
  else {
    local_88.current = (local_48.member.next - local_48.member.size) % local_68.current;
    local_68.current = local_48.member.next % local_68.current;
  }
  local_88.parent = &local_48;
  local_68.parent = &local_48;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_88,&local_68);
  iVar3 = 0;
  if (!bVar1) {
    piVar4 = local_58;
    iVar3 = 0;
    do {
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_88);
      iVar3 = iVar3 + *piVar4 * *piVar2;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      piVar4 = piVar4 + 1;
      bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                        (&local_88,&local_68);
    } while (!bVar1);
  }
  local_88.parent = (view_pointer)CONCAT44(local_88.parent._4_4_,iVar3);
  local_68.parent = (view_pointer)CONCAT44(local_68.parent._4_4_,0x16b0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "22 * 55 + 33 * 22 + 44 * 33 + 55 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x37,"void inner_product_suite::test_overfull()",&local_88,&local_68);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  11 * 11 + 22 * 22 + 33 * 33 + 44 * 44);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  22 * 55 + 33 * 22 + 44 * 33 + 55 * 44);
}